

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

bool __thiscall Minisat::OnlineProofChecker::propagate(OnlineProofChecker *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Lit *pLVar5;
  Watcher *pWVar6;
  void *this_00;
  long in_RDI;
  int k;
  Watcher *w;
  Lit first;
  Lit false_lit;
  Clause *c;
  CRef cr;
  Lit blocker;
  Watcher *end;
  Watcher *j;
  Watcher *i_1;
  vec<Minisat::Watcher> *ws;
  Lit p;
  Lit l;
  int i;
  int num_props;
  CRef confl;
  Watcher *in_stack_fffffffffffffeb8;
  vec<Minisat::Watcher> *in_stack_fffffffffffffec0;
  OnlineProofChecker *in_stack_fffffffffffffec8;
  ostream *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  ostream *in_stack_fffffffffffffee0;
  lbool local_d5;
  int local_d4;
  lbool local_cd;
  int local_cc;
  int local_c8;
  lbool local_c1;
  int local_c0;
  uint8_t local_b9;
  int local_b8;
  lbool local_b1;
  int local_b0;
  lbool local_a9;
  int local_a8;
  int local_a4;
  Watcher local_a0;
  Watcher *local_98;
  Lit local_90;
  int local_8c;
  int local_88;
  Lit local_84;
  Clause *local_80;
  CRef local_74;
  lbool local_6d;
  int local_6c;
  lbool local_65;
  Lit local_64;
  Watcher *local_60;
  Watcher *local_58;
  Watcher *local_50;
  vec<Minisat::Watcher> *local_48;
  Lit local_3c;
  int local_38;
  lbool local_31;
  int local_30;
  lbool local_2a;
  lbool local_29;
  int local_28;
  lbool local_21;
  int local_20;
  int local_1c;
  int local_18;
  CRef local_14;
  
  local_14 = 0xffffffff;
  local_18 = 0;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             in_stack_fffffffffffffed0);
  if (3 < *(int *)(in_RDI + 0xf8)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ... ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if (4 < *(int *)(in_RDI + 0xf8)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ");
    iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x30));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4," units");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  for (local_1c = 0; iVar2 = local_1c,
      iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x30)), iVar2 < iVar3;
      local_1c = local_1c + 1) {
    pLVar5 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x30),local_1c);
    local_28 = pLVar5->x;
    local_20 = local_28;
    local_21 = value(in_stack_fffffffffffffec8,(Lit)(int)in_stack_fffffffffffffed0);
    lbool::lbool(&local_29,'\0');
    bVar1 = lbool::operator==(&local_21,local_29);
    if (!bVar1) {
      local_30 = local_20;
      local_2a = value(in_stack_fffffffffffffec8,(Lit)(int)in_stack_fffffffffffffed0);
      lbool::lbool(&local_31,'\x01');
      bVar1 = lbool::operator==(&local_2a,local_31);
      if (bVar1) {
        return true;
      }
      local_38 = local_20;
      uncheckedEnqueue((OnlineProofChecker *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (Lit)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    }
  }
  do {
    iVar2 = *(int *)(in_RDI + 0xb0);
    iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0xb8));
    if (iVar3 <= iVar2) {
      if (5 < *(int *)(in_RDI + 0xf8)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate returns ");
        this_00 = (void *)std::ostream::operator<<(poVar4,local_14 != 0xffffffff);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      return local_14 != 0xffffffff;
    }
    iVar2 = *(int *)(in_RDI + 0xb0);
    *(int *)(in_RDI + 0xb0) = iVar2 + 1;
    pLVar5 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0xb8),iVar2);
    local_3c.x = pLVar5->x;
    local_18 = local_18 + 1;
    if (5 < *(int *)(in_RDI + 0xf8)) {
      std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate lit ");
      poVar4 = operator<<(in_stack_fffffffffffffee0,
                          (Lit *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_48 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
               operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                           *)in_stack_fffffffffffffed0,(Lit *)in_stack_fffffffffffffec8);
    if (6 < *(int *)(in_RDI + 0xf8)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with ");
      iVar2 = vec<Minisat::Watcher>::size(local_48);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," longer clauses");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    pWVar6 = vec::operator_cast_to_Watcher_((vec *)local_48);
    local_58 = pWVar6;
    local_50 = pWVar6;
    iVar2 = vec<Minisat::Watcher>::size(local_48);
    local_60 = pWVar6 + iVar2;
LAB_001171a2:
    if (local_50 == local_60) goto LAB_001178b5;
    if (7 < *(int *)(in_RDI + 0xf8)) {
      std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with clause ");
      ClauseAllocator::operator[]
                ((ClauseAllocator *)in_stack_fffffffffffffec0,
                 (Ref)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      poVar4 = operator<<(in_stack_fffffffffffffed0,(Clause *)in_stack_fffffffffffffec8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_6c = (local_50->blocker).x;
    local_64.x = local_6c;
    local_65 = value(in_stack_fffffffffffffec8,(Lit)(int)in_stack_fffffffffffffed0);
    lbool::lbool(&local_6d,'\0');
    bVar1 = lbool::operator==(&local_65,local_6d);
    if (bVar1) {
      if (8 < *(int *)(in_RDI + 0xf8)) {
        std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] clause is true by blocker ");
        poVar4 = operator<<(in_stack_fffffffffffffee0,
                            (Lit *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        std::operator<<(poVar4," in ");
        ClauseAllocator::operator[]
                  ((ClauseAllocator *)in_stack_fffffffffffffec0,
                   (Ref)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        poVar4 = operator<<(in_stack_fffffffffffffed0,(Clause *)in_stack_fffffffffffffec8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      *local_58 = *local_50;
      local_58 = local_58 + 1;
      local_50 = local_50 + 1;
      goto LAB_001171a2;
    }
    local_74 = local_50->cref;
    local_80 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_fffffffffffffec0,
                          (Ref)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_88 = local_3c.x;
    local_84 = operator~(local_3c);
    pLVar5 = Clause::operator[](local_80,0);
    local_8c = local_84.x;
    bVar1 = Lit::operator==(pLVar5,local_84);
    if (bVar1) {
      in_stack_fffffffffffffee0 = (ostream *)Clause::operator[](local_80,1);
      pLVar5 = Clause::operator[](local_80,0);
      pLVar5->x = *(int *)in_stack_fffffffffffffee0;
      pLVar5 = Clause::operator[](local_80,1);
      pLVar5->x = local_84.x;
    }
    local_50 = local_50 + 1;
    pLVar5 = Clause::operator[](local_80,0);
    local_a4 = pLVar5->x;
    local_90.x = local_a4;
    Watcher::Watcher(&local_a0,local_74,(Lit)local_a4);
    local_98 = &local_a0;
    local_a8 = local_64.x;
    bVar1 = Lit::operator!=(&local_90,local_64);
    in_stack_fffffffffffffedc = in_stack_fffffffffffffedc & 0xffffff;
    if (bVar1) {
      local_b0 = local_90.x;
      local_a9 = value(in_stack_fffffffffffffec8,(Lit)(int)in_stack_fffffffffffffed0);
      lbool::lbool(&local_b1,'\0');
      bVar1 = lbool::operator==(&local_a9,local_b1);
      in_stack_fffffffffffffedc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
    }
    if ((char)(in_stack_fffffffffffffedc >> 0x18) != '\0') {
      if (8 < *(int *)(in_RDI + 0xf8)) {
        std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] clause is true by other watch ");
        poVar4 = operator<<(in_stack_fffffffffffffee0,
                            (Lit *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        std::operator<<(poVar4," in ");
        poVar4 = operator<<(in_stack_fffffffffffffed0,(Clause *)in_stack_fffffffffffffec8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      *local_58 = *local_98;
      local_58 = local_58 + 1;
      goto LAB_001171a2;
    }
    local_b8 = 2;
    while (in_stack_fffffffffffffed8 = local_b8, iVar2 = Clause::size(local_80),
          in_stack_fffffffffffffed8 < iVar2) {
      pLVar5 = Clause::operator[](local_80,local_b8);
      local_c0 = pLVar5->x;
      local_b9 = (uint8_t)value(in_stack_fffffffffffffec8,(Lit)(int)in_stack_fffffffffffffed0);
      lbool::lbool(&local_c1,'\x01');
      bVar1 = lbool::operator!=((lbool *)in_stack_fffffffffffffeb8,
                                (lbool)(uint8_t)((ulong)in_stack_fffffffffffffec0 >> 0x38));
      if (bVar1) {
        if (8 < *(int *)(in_RDI + 0xf8)) {
          in_stack_fffffffffffffed0 =
               std::operator<<((ostream *)&std::cerr,
                               "c [DRAT-OTFC] found new watch for the clause: ");
          Clause::operator[](local_80,local_b8);
          poVar4 = operator<<(in_stack_fffffffffffffee0,
                              (Lit *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          std::operator<<(poVar4," in ");
          poVar4 = operator<<(in_stack_fffffffffffffed0,(Clause *)in_stack_fffffffffffffec8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        in_stack_fffffffffffffec0 = (vec<Minisat::Watcher> *)Clause::operator[](local_80,local_b8);
        pLVar5 = Clause::operator[](local_80,1);
        pLVar5->x = *(int *)&in_stack_fffffffffffffec0->data;
        pLVar5 = Clause::operator[](local_80,local_b8);
        pLVar5->x = local_84.x;
        in_stack_fffffffffffffec8 = (OnlineProofChecker *)(in_RDI + 0x58);
        pLVar5 = Clause::operator[](local_80,1);
        local_cc = pLVar5->x;
        local_c8 = (int)operator~((Lit)local_cc);
        OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
                  ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                    *)in_stack_fffffffffffffed0,(Lit *)in_stack_fffffffffffffec8);
        vec<Minisat::Watcher>::push(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        goto LAB_001171a2;
      }
      local_b8 = local_b8 + 1;
    }
    *local_58 = *local_98;
    local_d4 = local_90.x;
    local_58 = local_58 + 1;
    local_cd = value(in_stack_fffffffffffffec8,(Lit)(int)in_stack_fffffffffffffed0);
    lbool::lbool(&local_d5,'\x01');
    bVar1 = lbool::operator==(&local_cd,local_d5);
    if (!bVar1) {
      if (8 < *(int *)(in_RDI + 0xf8)) {
        std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] enqueue ");
        poVar4 = operator<<(in_stack_fffffffffffffee0,
                            (Lit *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        in_stack_fffffffffffffeb8 = (Watcher *)std::operator<<(poVar4," with reason ");
        ClauseAllocator::operator[]
                  ((ClauseAllocator *)in_stack_fffffffffffffec0,
                   (Ref)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        poVar4 = operator<<(in_stack_fffffffffffffed0,(Clause *)in_stack_fffffffffffffec8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      uncheckedEnqueue((OnlineProofChecker *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (Lit)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      goto LAB_001171a2;
    }
    local_14 = local_74;
    iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0xb8));
    *(int *)(in_RDI + 0xb0) = iVar2;
    while (local_50 < local_60) {
      *local_58 = *local_50;
      local_58 = local_58 + 1;
      local_50 = local_50 + 1;
    }
LAB_001178b5:
    vec<Minisat::Watcher>::shrink_(local_48,(int)((long)local_50 - (long)local_58 >> 3));
  } while( true );
}

Assistant:

inline bool OnlineProofChecker::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();

    DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] propagate ... " << std::endl;);

    // propagate units first!
    DOUT(if (verbose > 4) std::cerr << "c [DRAT-OTFC] propagate " << unitClauses.size() << " units" << std::endl;);
    for (int i = 0; i < unitClauses.size(); ++i) { // propagate all known units
        const Lit l = unitClauses[i];
        if (value(l) == l_True) {
            continue;
        } else if (value(l) == l_False) {
            return true;
        } else {
            uncheckedEnqueue(l);
        }
    }


    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        num_props++;
        DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate lit " << p << std::endl;);

        vec<Watcher> &ws = watches[p];
        DOUT(if (verbose > 6) std::cerr << "c [DRAT-OTFC] propagate with " << ws.size() << " longer clauses" << std::endl;);
        Watcher *i, *j, *end;
        // propagate longer clauses here!
        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            DOUT(if (verbose > 7) std::cerr << "c [DRAT-OTFC] propagate with clause " << ca[i->cref] << std::endl;);

            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) { // keep binary clauses, and clauses where the blocking literal is satisfied
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by blocker " << blocker << " in "
                                                << ca[i->cref] << std::endl;);
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            const Lit false_lit = ~p;
            if (c[0] == false_lit) {
                c[0] = c[1], c[1] = false_lit;
            }
            assert(c[1] == false_lit && "wrong literal order in the clause!");
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            const Watcher &w = Watcher(cr, first);            // updates the blocking literal
            if (first != blocker && value(first) == l_True) { // satisfied clause
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by other watch " << first << " in "
                                                << c << std::endl;);
                *j++ = w;
                continue;
            } // same as goto NextClause;

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False) {
                    DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] found new watch for the clause: " << c[k]
                                                    << " in " << c << std::endl;);
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                } // no need to indicate failure of lhbr, because remaining code is skipped in this case!

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) {
                    *j++ = *i++;
                }
                break;
            } else {
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] enqueue " << first << " with reason " << ca[cr] << std::endl;);
                uncheckedEnqueue(first);
            }
        NextClause:;
        }
        ws.shrink_(i - j); // remove all duplciate clauses!
    }
    DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate returns " << (confl != CRef_Undef) << std::endl;);
    return (confl != CRef_Undef); // return true, if something was found!
}